

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void Curl_conninfo_local(Curl_easy *data,curl_socket_t sockfd,char *param_3,int *param_4)

{
  uint err;
  _Bool _Var1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  char *fmt;
  curl_socklen_t slen;
  Curl_sockaddr_storage ssloc;
  char buffer [256];
  socklen_t local_1ac;
  sockaddr local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  char local_128 [264];
  
  local_1ac = 0x80;
  local_1a8.sa_family = 0;
  local_1a8.sa_data[0] = '\0';
  local_1a8.sa_data[1] = '\0';
  local_1a8.sa_data[2] = '\0';
  local_1a8.sa_data[3] = '\0';
  local_1a8.sa_data[4] = '\0';
  local_1a8.sa_data[5] = '\0';
  local_1a8.sa_data[6] = '\0';
  local_1a8.sa_data[7] = '\0';
  local_1a8.sa_data[8] = '\0';
  local_1a8.sa_data[9] = '\0';
  local_1a8.sa_data[10] = '\0';
  local_1a8.sa_data[0xb] = '\0';
  local_1a8.sa_data[0xc] = '\0';
  local_1a8.sa_data[0xd] = '\0';
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  uStack_130 = 0;
  iVar2 = getsockname(sockfd,&local_1a8,&local_1ac);
  if (iVar2 == 0) {
    _Var1 = Curl_addr2string((sockaddr *)&local_1a8,local_1ac,param_3,param_4);
    if (_Var1) {
      return;
    }
    fmt = "ssloc inet_ntop() failed with errno %d: %s";
  }
  else {
    fmt = "getsockname() failed with errno %d: %s";
  }
  puVar3 = (uint *)__errno_location();
  err = *puVar3;
  pcVar4 = Curl_strerror(err,local_128,0x100);
  Curl_failf(data,fmt,(ulong)err,pcVar4);
  return;
}

Assistant:

void Curl_conninfo_local(struct Curl_easy *data, curl_socket_t sockfd,
                         char *local_ip, int *local_port)
{
#ifdef HAVE_GETSOCKNAME
  char buffer[STRERROR_LEN];
  struct Curl_sockaddr_storage ssloc;
  curl_socklen_t slen;
  slen = sizeof(struct Curl_sockaddr_storage);
  memset(&ssloc, 0, sizeof(ssloc));
  if(getsockname(sockfd, (struct sockaddr*) &ssloc, &slen)) {
    int error = SOCKERRNO;
    failf(data, "getsockname() failed with errno %d: %s",
          error, Curl_strerror(error, buffer, sizeof(buffer)));
    return;
  }
  if(!Curl_addr2string((struct sockaddr*)&ssloc, slen,
                       local_ip, local_port)) {
    failf(data, "ssloc inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    return;
  }
#else
  (void)data;
  (void)sockfd;
  (void)local_ip;
  (void)local_port;
#endif
}